

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O3

PtrWrapper<MapWrapper> * __thiscall
ashared_ptr<MapWrapper>::shareCurObject(ashared_ptr<MapWrapper> *this)

{
  atomic<unsigned_long> *paVar1;
  int iVar2;
  PtrWrapper<MapWrapper> *pPVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 == 0) {
    if ((this->object)._M_b._M_p == (__pointer_type)0x0) {
      pPVar3 = (PtrWrapper<MapWrapper> *)0x0;
    }
    else {
      LOCK();
      paVar1 = &((this->object)._M_b._M_p)->refCount;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      pPVar3 = (this->object)._M_b._M_p;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return pPVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

PtrWrapper<T>* shareCurObject() {
        std::lock_guard<std::mutex> l(lock);
        if (!object.load(MO)) return nullptr;

        // Now no one can change `object`.
        // By increasing its ref count, `object` will be safe
        // until the new holder (i.e., caller) is destructed.
        object.load(MO)->refCount.fetch_add(1, MO);
        return object.load(MO);
    }